

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

OptionsType * __thiscall
google::protobuf::DescriptorBuilder::
AllocateOptionsImpl<google::protobuf::Descriptor::ExtensionRange>
          (DescriptorBuilder *this,string_view name_scope,string_view element_name,Proto *proto,
          Span<const_int> options_path,string_view option_name,FlatAllocator *alloc)

{
  PointerT<google::protobuf::ExtensionRangeOptions> pEVar1;
  ulong uVar2;
  DescriptorPool *this_00;
  bool bVar3;
  string *psVar4;
  Symbol SVar5;
  const_reference pUVar6;
  FieldDescriptor *pFVar7;
  MessageLite *to;
  size_type sVar8;
  undefined8 uVar9;
  pointer_____offset_0x10___ *opt;
  int iVar10;
  char *pcVar11;
  Symbol extendee;
  int i;
  int iVar12;
  undefined1 *this_01;
  pointer_____offset_0x10___ *msg;
  string_view from;
  string_view element_name_00;
  OptionsToInterpret local_118;
  undefined1 local_b0 [40];
  char *local_88;
  AlphaNum local_60;
  
  to = (MessageLite *)element_name._M_len;
  bVar3 = DescriptorProto_ExtensionRange::has_options(proto);
  opt = &_ExtensionRangeOptions_default_instance_;
  if (!bVar3) {
    return (OptionsType *)opt;
  }
  msg = (pointer_____offset_0x10___ *)(proto->field_0)._impl_.options_;
  if ((ExtensionRangeOptions *)msg == (ExtensionRangeOptions *)0x0) {
    msg = &_ExtensionRangeOptions_default_instance_;
  }
  if ((alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).pointers_.payload_.super_Base<char>.value == (PointerT<char>)0x0) {
    pcVar11 = "has_allocated()";
    sVar8 = 0xf;
    uVar9 = 0x195;
  }
  else {
    pEVar1 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).pointers_.payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value;
    iVar12 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).used_.payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value;
    iVar10 = iVar12 + 1;
    (alloc->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).used_.payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value = iVar10;
    psVar4 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                       (iVar10,(alloc->
                               super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                               ).total_.payload_.super_Base<google::protobuf::ExtensionRangeOptions>
                               .value,"used <= total_.template Get<TypeToUse>()");
    if (psVar4 == (string *)0x0) {
      bVar3 = ExtensionRangeOptions::IsInitializedImpl((MessageLite *)msg);
      if (bVar3) {
        opt = (pointer_____offset_0x10___ *)(pEVar1 + iVar12);
        MessageLite::SerializeAsString_abi_cxx11_(&local_118.name_scope,(MessageLite *)msg);
        from._M_str = (char *)opt;
        from._M_len = (size_t)local_118.name_scope._M_dataplus._M_p;
        bVar3 = internal::ParseNoReflection
                          ((internal *)local_118.name_scope._M_string_length,from,to);
        std::__cxx11::string::~string((string *)&local_118);
        if (!bVar3) {
          pcVar11 = "parse_success";
          sVar8 = 0xd;
          uVar9 = 0x1545;
          goto LAB_001f9104;
        }
        if (0 < *(int *)((long)&((OptionsType *)opt)->field_0 + 0x40)) {
          anon_unknown_23::OptionsToInterpret::OptionsToInterpret
                    (&local_118,name_scope,element_name,options_path,(Message *)msg,(Message *)opt);
          std::
          vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
          ::push_back(&this->options_to_interpret_,&local_118);
          anon_unknown_23::OptionsToInterpret::~OptionsToInterpret(&local_118);
        }
        uVar2 = (((ExtensionRangeOptions *)msg)->super_Message).super_MessageLite.
                _internal_metadata_.ptr_;
        if ((uVar2 & 1) == 0) {
          this_01 = UnknownFieldSet::default_instance()::instance;
        }
        else {
          this_01 = (undefined1 *)((uVar2 & 0xfffffffffffffffe) + 8);
        }
        bVar3 = RepeatedField<google::protobuf::UnknownField>::empty
                          ((RepeatedField<google::protobuf::UnknownField> *)this_01);
        if ((!bVar3) &&
           (SVar5 = DescriptorPool::Tables::FindSymbol(this->tables_,option_name),
           (SVar5.ptr_)->symbol_type_ == '\x01')) {
          for (iVar12 = 0;
              iVar10 = RepeatedField<google::protobuf::UnknownField>::size
                                 ((RepeatedField<google::protobuf::UnknownField> *)this_01),
              iVar12 < iVar10; iVar12 = iVar12 + 1) {
            assert_mutex_held(this->pool_);
            this_00 = this->pool_;
            extendee.ptr_ = &((Descriptor *)0x0)->super_SymbolBase;
            if ((SVar5.ptr_)->symbol_type_ == '\x01') {
              extendee = SVar5;
            }
            pUVar6 = RepeatedField<google::protobuf::UnknownField>::Get
                               ((RepeatedField<google::protobuf::UnknownField> *)this_01,iVar12);
            pFVar7 = DescriptorPool::InternalFindExtensionByNumberNoLock
                               (this_00,(Descriptor *)extendee.ptr_,pUVar6->number_);
            if (pFVar7 != (FieldDescriptor *)0x0) {
              local_118.name_scope._M_dataplus._M_p = (pointer)pFVar7->file_;
              absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
              ::erase<google::protobuf::FileDescriptor_const*>
                        ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                          *)&this->unused_dependency_,
                         (key_arg<const_google::protobuf::FileDescriptor_*> *)&local_118);
            }
          }
        }
      }
      else {
        local_118.name_scope._M_dataplus._M_p = (pointer)name_scope._M_len;
        local_118.name_scope._M_string_length = (size_type)name_scope._M_str;
        local_60.piece_ = absl::lts_20240722::NullSafeStringView(".");
        local_b0._32_8_ = (MessageLite *)element_name._M_len;
        local_88 = element_name._M_str;
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_b0,(AlphaNum *)&local_118,&local_60)
        ;
        element_name_00._M_str = (char *)local_b0._0_8_;
        element_name_00._M_len = local_b0._8_8_;
        AddError(this,element_name_00,(Message *)msg,OPTION_NAME,
                 "Uninterpreted option is missing name or value.");
        std::__cxx11::string::~string((string *)local_b0);
      }
      return (OptionsType *)opt;
    }
    pcVar11 = (psVar4->_M_dataplus)._M_p;
    sVar8 = psVar4->_M_string_length;
    uVar9 = 0x19b;
  }
LAB_001f9104:
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_118,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
             ,uVar9,sVar8,pcVar11);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_118)
  ;
}

Assistant:

const typename DescriptorT::OptionsType* DescriptorBuilder::AllocateOptionsImpl(
    absl::string_view name_scope, absl::string_view element_name,
    const typename DescriptorT::Proto& proto,
    absl::Span<const int> options_path, absl::string_view option_name,
    internal::FlatAllocator& alloc) {
  if (!proto.has_options()) {
    return &DescriptorT::OptionsType::default_instance();
  }
  const typename DescriptorT::OptionsType& orig_options = proto.options();

  auto* options = alloc.AllocateArray<typename DescriptorT::OptionsType>(1);

  if (!orig_options.IsInitialized()) {
    AddError(absl::StrCat(name_scope, ".", element_name), orig_options,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "Uninterpreted option is missing name or value.");
    return &DescriptorT::OptionsType::default_instance();
  }

  const bool parse_success =
      internal::ParseNoReflection(orig_options.SerializeAsString(), *options);
  ABSL_DCHECK(parse_success);

  // Don't add to options_to_interpret_ unless there were uninterpreted
  // options.  This not only avoids unnecessary work, but prevents a
  // bootstrapping problem when building descriptors for descriptor.proto.
  // descriptor.proto does not contain any uninterpreted options, but
  // attempting to interpret options anyway will cause
  // OptionsType::GetDescriptor() to be called which may then deadlock since
  // we're still trying to build it.
  if (options->uninterpreted_option_size() > 0) {
    options_to_interpret_.push_back(OptionsToInterpret(
        name_scope, element_name, options_path, &orig_options, options));
  }

  // If the custom option is in unknown fields, no need to interpret it.
  // Remove the dependency file from unused_dependency.
  const UnknownFieldSet& unknown_fields = orig_options.unknown_fields();
  if (!unknown_fields.empty()) {
    // Can not use options->GetDescriptor() which may case deadlock.
    Symbol msg_symbol = tables_->FindSymbol(option_name);
    if (msg_symbol.type() == Symbol::MESSAGE) {
      for (int i = 0; i < unknown_fields.field_count(); ++i) {
        assert_mutex_held(pool_);
        const FieldDescriptor* field =
            pool_->InternalFindExtensionByNumberNoLock(
                msg_symbol.descriptor(), unknown_fields.field(i).number());
        if (field) {
          unused_dependency_.erase(field->file());
        }
      }
    }
  }
  return options;
}